

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightBounds * __thiscall pbrt::GoniometricLight::Bounds(GoniometricLight *this)

{
  WrapMode2D wrapMode;
  Tuple2<pbrt::Point2,_int> this_00;
  Point3<float> *this_01;
  Tuple2<pbrt::Point2,_int> in_RSI;
  LightBounds *in_RDI;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  Point3<float> PVar5;
  Point3f p;
  Float phi;
  Point3<float> *in_stack_000000a8;
  Transform *in_stack_000000b0;
  int u;
  Float sinTheta;
  int v;
  int height;
  int width;
  Float weightedMaxImageSum;
  float in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  float x;
  DenselySampledSpectrum *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  undefined1 twoSided;
  Float in_stack_ffffffffffffff14;
  long in_stack_ffffffffffffff18;
  Vector3f *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  Float in_stack_ffffffffffffff2c;
  LightBounds *this_02;
  Vector3f local_60 [4];
  int local_30;
  Float local_2c;
  int local_28;
  Tuple2<pbrt::Point2,_int> local_24;
  int local_1c;
  WrapMode WVar6;
  WrapMode WVar7;
  Tuple2<pbrt::Point2,_int> p_00;
  undefined1 auVar4 [56];
  
  WVar7 = Repeat;
  this_02 = in_RDI;
  p_00 = in_RSI;
  this_00 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)((long)in_RSI + 200));
  WVar6 = this_00.x;
  local_24 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)((long)in_RSI + 200));
  local_1c = local_24.y;
  for (local_28 = 0; local_28 < local_1c; local_28 = local_28 + 1) {
    auVar2._0_4_ = (((float)local_28 + 0.5) * 3.1415927) / (float)local_1c;
    auVar2._4_12_ = SUB6012((undefined1  [60])0x0,0);
    dVar1 = std::sin(auVar2._0_8_);
    local_2c = SUB84(dVar1,0);
    for (local_30 = 0; local_30 < (int)WVar6; local_30 = local_30 + 1) {
      in_stack_ffffffffffffff18 = (long)in_RSI + 200;
      in_stack_ffffffffffffff14 = local_2c;
      Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                          (int)in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff20 = local_60;
      wrapMode.wrap.values[1] = WVar7;
      wrapMode.wrap.values[0] = WVar6;
      Image::GetChannels((Image *)this_00,(Point2i)p_00,wrapMode);
      in_stack_ffffffffffffff2c =
           ImageChannelValues::MaxValue
                     ((ImageChannelValues *)
                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffff2c),
                               ZEXT416((uint)in_stack_ffffffffffffff14),ZEXT416(WVar7));
      WVar7 = auVar2._0_4_;
      ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x6ee84d);
    }
  }
  x = *(float *)((long)in_RSI + 0xc0);
  DenselySampledSpectrum::MaxValue(in_stack_ffffffffffffff00);
  twoSided = (undefined1)((uint)in_stack_ffffffffffffff10 >> 0x18);
  this_01 = (Point3<float> *)((long)in_RSI + 0x18);
  auVar4 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  Point3<float>::Point3(this_01,x,in_stack_fffffffffffffef8,0.0);
  PVar5 = Transform::operator()(in_stack_000000b0,in_stack_000000a8);
  auVar3._0_8_ = PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar4;
  vmovlpd_avx(auVar3._0_16_);
  Vector3<float>::Vector3((Vector3<float> *)this_01,x,in_stack_fffffffffffffef8,0.0);
  LightBounds::LightBounds
            (this_02,(Point3f *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff20,(Float)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (Float)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,(bool)twoSided);
  return in_RDI;
}

Assistant:

LightBounds GoniometricLight::Bounds() const {
    // Like Phi() method, but compute the weighted max component value of
    // the image map.
    Float weightedMaxImageSum = 0;
    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        Float sinTheta = std::sin(Pi * Float(v + .5f) / Float(height));
        for (int u = 0; u < width; ++u)
            weightedMaxImageSum +=
                sinTheta * image.GetChannels({u, v}, wrapMode).MaxValue();
    }
    Float phi =
        scale * I.MaxValue() * 2 * Pi * Pi * weightedMaxImageSum / (width * height);

    Point3f p = renderFromLight(Point3f(0, 0, 0));
    // Bound it as an isotropic point light.
    return LightBounds(p, Vector3f(0, 0, 1), phi, Pi, Pi / 2, false);
}